

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

TypeAndOffset * __thiscall
soul::SubElementPath::getElement
          (TypeAndOffset *__return_storage_ptr__,SubElementPath *this,Type *parentType)

{
  unsigned_long *puVar1;
  Category CVar2;
  bool bVar3;
  uint64_t uVar4;
  Structure *pSVar5;
  Member *pMVar6;
  int line;
  size_t i;
  ulong index;
  unsigned_long *puVar7;
  char *local_50;
  Type local_48;
  
  Type::Type(&__return_storage_ptr__->type,parentType);
  __return_storage_ptr__->offset = 0;
  puVar7 = (this->indexes).items;
  puVar1 = puVar7 + (this->indexes).numActive;
  local_50 = "! e.type.isUnsizedArray()";
  do {
    if (puVar7 == puVar1) {
      return __return_storage_ptr__;
    }
    CVar2 = (__return_storage_ptr__->type).category;
    if ((CVar2 & ~primitive) == vector) {
      if ((CVar2 == array) && ((__return_storage_ptr__->type).boundingSize == 0)) {
        line = 0x22e;
LAB_001e16dc:
        throwInternalCompilerError(local_50,"getElement",line);
      }
      bVar3 = Type::isValidArrayOrVectorIndex<unsigned_long>(&__return_storage_ptr__->type,*puVar7);
      if (!bVar3) {
        line = 0x22f;
        local_50 = "e.type.isValidArrayOrVectorIndex (index)";
        goto LAB_001e16dc;
      }
      Type::getElementType(&local_48,&__return_storage_ptr__->type);
      Type::operator=(&__return_storage_ptr__->type,&local_48);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
      uVar4 = Type::getPackedSizeInBytes(&__return_storage_ptr__->type);
      __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar4 * *puVar7;
    }
    else {
      if (CVar2 != structure) {
        throwInternalCompilerError("getElement",0x242);
      }
      pSVar5 = Type::getStructRef(&__return_storage_ptr__->type);
      if ((pSVar5->members).numActive <= *puVar7) {
        throwInternalCompilerError("index < members.size()","getElement",0x239);
      }
      pMVar6 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                         (&pSVar5->members,*puVar7);
      Type::operator=(&__return_storage_ptr__->type,&pMVar6->type);
      for (index = 0; index < *puVar7; index = index + 1) {
        pMVar6 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                           (&pSVar5->members,index);
        uVar4 = Type::getPackedSizeInBytes(&pMVar6->type);
        __return_storage_ptr__->offset = __return_storage_ptr__->offset + uVar4;
      }
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

SubElementPath::TypeAndOffset SubElementPath::getElement (const Type& parentType) const
{
    TypeAndOffset e { parentType, 0 };

    for (auto& index : indexes)
    {
        if (e.type.isArrayOrVector())
        {
            SOUL_ASSERT (! e.type.isUnsizedArray());
            SOUL_ASSERT (e.type.isValidArrayOrVectorIndex (index));

            e.type = e.type.getElementType();
            e.offset += ((size_t) e.type.getPackedSizeInBytes()) * index;
            continue;
        }

        if (e.type.isStruct())
        {
            auto& members = e.type.getStructRef().getMembers();
            SOUL_ASSERT (index < members.size());
            e.type = members[index].type;

            for (size_t i = 0; i < index; ++i)
                e.offset += (size_t) members[i].type.getPackedSizeInBytes();

            continue;
        }

        SOUL_ASSERT_FALSE;
    }

    return e;
}